

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O2

void exchange_bounds(void *b_,ReduceProxy *srp)

{
  pointer pBVar1;
  pointer pBVar2;
  Master *this;
  Link *pLVar3;
  int iVar4;
  mapped_type *bb;
  long lVar5;
  int i;
  long lVar6;
  BlockID local_b0;
  
  if (srp->round_ == 0) {
    for (lVar5 = 0;
        lVar5 < (int)((ulong)((long)(srp->out_link_).neighbors_.
                                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(srp->out_link_).neighbors_.
                                   super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
        lVar5 = lVar5 + 1) {
      this = (srp->super_Proxy).master_;
      iVar4 = diy::Master::lid(this,(srp->super_Proxy).gid_);
      pLVar3 = (this->links_).super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar4];
      local_b0 = (srp->out_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5];
      bb = Catch::clara::std::
           map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
           ::operator[](&(srp->super_Proxy).outgoing_,(key_type *)&local_b0);
      diy::Serialization<diy::Bounds<float>_>::save
                (&bb->super_BinaryBuffer,
                 (Bounds<float> *)
                 ((long)&pLVar3[7].neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_> + 8));
    }
  }
  else {
    pBVar1 = (srp->in_link_).neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pBVar2 = (srp->in_link_).neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_start;
    diy::Bounds<float>::Bounds((Bounds<float> *)&local_b0,0);
    Catch::clara::std::vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>::resize
              ((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)((long)b_ + 0x98)
               ,(long)(int)((ulong)((long)pBVar1 - (long)pBVar2) >> 3),(Bounds<float> *)&local_b0);
    diy::Bounds<float>::~Bounds((Bounds<float> *)&local_b0);
    lVar5 = 0;
    for (lVar6 = 0;
        pBVar1 = (srp->in_link_).neighbors_.
                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar6 < (int)((ulong)((long)(srp->in_link_).neighbors_.
                                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3);
        lVar6 = lVar6 + 1) {
      diy::Master::Proxy::dequeue<diy::Bounds<float>>
                (&srp->super_Proxy,pBVar1[lVar6].gid,
                 (Bounds<float> *)
                 ((long)(((((vector<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_> *)
                           ((long)b_ + 0x98))->
                          super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->min).
                        super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_static_data +
                 lVar5 + 0xffffffffffffffe0U),diy::load<diy::Bounds<float>>);
      lVar5 = lVar5 + 0x80;
    }
  }
  return;
}

Assistant:

void exchange_bounds(void* b_, const diy::ReduceProxy& srp)
{
  Block*   b   = static_cast<Block*>(b_);

  if (srp.round() == 0)
      for (int i = 0; i < srp.out_link().size(); ++i)
      {
          RCLink* link = static_cast<RCLink*>(srp.master()->link(srp.master()->lid(srp.gid())));
          srp.enqueue(srp.out_link().target(i), link->bounds());
      }
  else
  {
      b->block_bounds.resize(srp.in_link().size(), 0);
      for (int i = 0; i < srp.in_link().size(); ++i)
      {
        assert(i == srp.in_link().target(i).gid);
        srp.dequeue(srp.in_link().target(i).gid, b->block_bounds[i]);
      }
  }
}